

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fire_PDU.cpp
# Opt level: O2

KBOOL __thiscall KDIS::PDU::Fire_PDU::operator==(Fire_PDU *this,Fire_PDU *Value)

{
  KBOOL KVar1;
  
  KVar1 = Warfare_Header::operator!=(&this->super_Warfare_Header,&Value->super_Warfare_Header);
  if ((((!KVar1) && (this->m_ui32FireMissionIndex == Value->m_ui32FireMissionIndex)) &&
      (KVar1 = DATA_TYPE::WorldCoordinates::operator!=(&this->m_Location,&Value->m_Location), !KVar1
      )) && ((KVar1 = DATA_TYPE::Descriptor::operator!=
                                ((this->m_pDescriptor).m_pRef,(Value->m_pDescriptor).m_pRef), !KVar1
             && (KVar1 = DATA_TYPE::Vector::operator!=(&this->m_Velocity,&Value->m_Velocity), !KVar1
                )))) {
    return (KBOOL)(-((float)Value->m_f32Range == (float)this->m_f32Range) & 1);
  }
  return false;
}

Assistant:

KBOOL Fire_PDU::operator == ( const Fire_PDU & Value ) const
{
    if( Warfare_Header::operator !=( Value ) )                      return false;
    if( m_ui32FireMissionIndex   != Value.m_ui32FireMissionIndex )  return false;
    if( m_Location               != Value.m_Location )              return false;
    if( *m_pDescriptor           != *Value.m_pDescriptor )          return false;
    if( m_Velocity               != Value.m_Velocity )              return false;
    if( m_f32Range               != Value.m_f32Range )              return false;
    return true;
}